

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

counting_iterator __thiscall
duckdb_fmt::v6::internal::float_writer<wchar_t>::
prettify<duckdb_fmt::v6::internal::counting_iterator>
          (float_writer<wchar_t> *this,counting_iterator it)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  int i;
  uint uVar10;
  byte bVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  _Distance __n;
  counting_iterator cVar16;
  size_t sVar17;
  
  uVar12 = this->num_digits_;
  uVar8 = (ulong)uVar12;
  iVar13 = this->exp_;
  lVar15 = (long)(int)uVar12;
  uVar5 = iVar13 + uVar12;
  uVar7 = *(uint *)&(this->specs_).field_0x4;
  if ((uVar7 & 0xff) == 1) {
    iVar13 = (this->specs_).precision - uVar12;
    bVar11 = (byte)(uVar7 >> 0x1d) & 0 < iVar13;
    lVar15 = lVar15 + -1;
    if ((int)uVar12 < 2) {
      lVar15 = 0;
    }
    lVar4 = it.count_ + lVar15 + (ulong)(1 < (int)uVar12 | bVar11);
    lVar15 = (ulong)(iVar13 - 1) + 1;
    if (bVar11 == 0) {
      lVar15 = 0;
    }
    uVar5 = uVar5 - 1;
    lVar9 = lVar15 + lVar4 + 3;
    uVar12 = -uVar5;
    if (0 < (int)uVar5) {
      uVar12 = uVar5;
    }
    lVar15 = lVar15 + 4 + lVar4;
    if (uVar12 < 1000) {
      lVar15 = lVar9;
    }
    lVar15 = lVar15 + 1;
    if (uVar12 < 100) {
      lVar15 = lVar9;
    }
    return (counting_iterator)(lVar15 + 2);
  }
  if (iVar13 < 0) {
    if ((int)uVar5 < 1) {
      iVar13 = -uVar5;
      if (uVar12 == 0) {
        iVar6 = (this->specs_).precision;
        iVar3 = iVar13;
        if (SBORROW4(iVar6,iVar13) != (int)(iVar6 + uVar5) < 0) {
          iVar3 = iVar6;
        }
        if (-1 < iVar6) {
          iVar13 = iVar3;
        }
      }
      if (0 < (int)uVar12 && (uVar7 >> 0x1d & 1) == 0) {
        do {
          if (this->digits_[uVar8 - 1] != '0') goto LAB_011cb433;
          bVar1 = 1 < (long)uVar8;
          uVar8 = uVar8 - 1;
        } while (bVar1);
        uVar8 = 0;
      }
LAB_011cb433:
      iVar6 = (int)uVar8;
      if (iVar13 == 0 && iVar6 == 0) {
        it.count_ = it.count_ + 1;
      }
      else {
        sVar17 = it.count_ + 3 + (ulong)(iVar13 - 1);
        if (iVar13 < 1) {
          sVar17 = it.count_ + 2;
        }
        it.count_ = (long)iVar6 + sVar17;
        if (iVar6 < 1) {
          it.count_ = sVar17;
        }
      }
    }
    else {
      if ((int)uVar5 < 4 || (uVar7 & 0xff0000) == 0) {
        it.count_ = it.count_ + uVar5;
      }
      else {
        uVar14 = uVar5 % 3;
        if (uVar5 % 3 == 0) {
          uVar14 = 3;
        }
        iVar13 = 0;
        do {
          it.count_ = (0 < iVar13) + it.count_ + (ulong)uVar14;
          iVar13 = iVar13 + uVar14;
          uVar14 = 3;
        } while (iVar13 < (int)uVar5);
      }
      if ((uVar7 >> 0x1d & 1) == 0) {
        uVar7 = uVar12 - 1;
        if ((int)uVar5 < (int)(uVar12 - 1)) {
          uVar7 = uVar5;
        }
        do {
          if (this->digits_[lVar15 + -1] != '0') {
            uVar7 = (uint)lVar15;
            break;
          }
          lVar15 = lVar15 + -1;
        } while ((long)(ulong)uVar5 < lVar15);
        sVar17 = it.count_ + (uVar7 != uVar5);
        it.count_ = (sVar17 - uVar5) + (long)(int)uVar7;
        if ((int)uVar7 <= (int)uVar5) {
          it.count_ = sVar17;
        }
      }
      else {
        lVar15 = (it.count_ - uVar5) + lVar15;
        it.count_ = lVar15 + 1;
        iVar13 = (this->specs_).precision;
        iVar6 = iVar13 - uVar12;
        if ((iVar6 != 0 && (int)uVar12 <= iVar13) && (0 < iVar6)) {
          it.count_ = lVar15 + 2 + (ulong)(iVar6 - 1);
        }
      }
    }
  }
  else {
    if ((int)uVar5 < 4 || (uVar7 & 0xff0000) == 0) {
      lVar4 = 0;
      if (iVar13 != 0) {
        lVar4 = (ulong)(iVar13 - 1) + 1;
      }
      cVar16.count_ = lVar15 + it.count_;
      if ((int)uVar12 < 1) {
        cVar16.count_ = it.count_;
      }
      it.count_ = cVar16.count_ + lVar4;
    }
    else {
      uVar14 = 3;
      if (uVar5 % 3 != 0) {
        uVar14 = uVar5 % 3;
      }
      iVar13 = 0;
      do {
        sVar17 = (0 < iVar13) + it.count_;
        uVar10 = uVar12 - iVar13;
        if (uVar10 == 0 || (int)uVar12 < iVar13) {
          it.count_ = sVar17 + uVar14;
        }
        else {
          uVar2 = uVar10;
          if ((int)uVar14 < (int)uVar10) {
            uVar2 = uVar14;
          }
          it.count_ = sVar17 + (long)(int)uVar2;
          if ((int)uVar10 < 1) {
            it.count_ = sVar17;
          }
          if ((int)uVar10 < (int)uVar14) {
            lVar15 = (ulong)((uVar14 - uVar2) - 1) + 1;
            if ((int)(uVar14 - uVar2) < 1) {
              lVar15 = 0;
            }
            it.count_ = it.count_ + lVar15;
          }
        }
        iVar13 = iVar13 + uVar14;
        uVar14 = 3;
      } while (iVar13 < (int)uVar5);
    }
    if ((uVar7 >> 0x1d & 1) != 0) {
      iVar13 = (this->specs_).precision;
      iVar6 = iVar13 - uVar5;
      if (iVar6 == 0 || iVar13 < (int)uVar5) {
        it.count_ = (it.count_ - ((uVar7 & 0xff) == 2)) + 2;
      }
      else {
        it.count_ = it.count_ + (iVar6 - 1) + 2;
      }
    }
  }
  return (counting_iterator)it.count_;
}

Assistant:

It prettify(It it) const {
    // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
    int full_exp = num_digits_ + exp_;
    if (specs_.format == float_format::exp) {
      // Insert a decimal point after the first digit and add an exponent.
      *it++ = static_cast<Char>(*digits_);
      int num_zeros = specs_.precision - num_digits_;
      bool trailing_zeros = num_zeros > 0 && specs_.trailing_zeros;
      if (num_digits_ > 1 || trailing_zeros) *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + 1, digits_ + num_digits_, it);
      if (trailing_zeros)
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      *it++ = static_cast<Char>(specs_.upper ? 'E' : 'e');
      return write_exponent<Char>(full_exp - 1, it);
    }
    if (num_digits_ <= full_exp) {
      // 1234e7 -> 12340000000[.0+]
      if (specs_.thousand_sep != '\0' && full_exp > 3) {
        // thousand separator
        // we need to print the thousand separator every 3 digits
        // the loop is essentially write 3 digits, write the thousand separator
        // the exception is the first batch of digits which are 1-3 digits
        int digit_count = full_exp % 3 == 0 ? 3 : full_exp % 3;
        for(int i = 0; i < full_exp; i += digit_count, digit_count = 3) {
          if (i > 0) {
            *it++ = specs_.thousand_sep;
          }
          if (i < num_digits_) {
            // we still need to write digits
            int write_count = std::min<int>(num_digits_ - i, digit_count);
            it = copy_str<Char>(digits_ + i, digits_ + i + write_count, it);
            if (write_count < digit_count) {
              // write any trailing zeros that belong to this batch
              it = std::fill_n(it, digit_count - write_count, static_cast<Char>('0'));
            }
          } else {
            // we only need to write trailing zeros
            it = std::fill_n(it, digit_count, static_cast<Char>('0'));
          }
        }
      } else {
        it = copy_str<Char>(digits_, digits_ + num_digits_, it);
        it = std::fill_n(it, full_exp - num_digits_, static_cast<Char>('0'));
      }
      if (specs_.trailing_zeros) {
        *it++ = decimal_point_;
        int num_zeros = specs_.precision - full_exp;
        if (num_zeros <= 0) {
          if (specs_.format != float_format::fixed)
            *it++ = static_cast<Char>('0');
          return it;
        }
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
        if (num_zeros > 1000)
          throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else if (full_exp > 0) {
      // 1234e-2 -> 12.34[0+]
      if (specs_.thousand_sep != '\0' && full_exp > 3) {
        // thousand separator
        // we need to print the thousand separator every 3 digits
        // the loop is essentially write 3 digits, write the thousand separator
        // the exception is the first batch of digits which are 1-3 digits
        int digit_count = full_exp % 3 == 0 ? 3 : full_exp % 3;
        for(int i = 0; i < full_exp; i += digit_count, digit_count = 3) {
          if (i > 0) {
            *it++ = specs_.thousand_sep;
          }
          it = copy_str<Char>(digits_ + i, digits_ + i + digit_count, it);
        }
      } else {
        it = copy_str<Char>(digits_, digits_ + full_exp, it);
      }
      if (!specs_.trailing_zeros) {
        // Remove trailing zeros.
        int num_digits = num_digits_;
        while (num_digits > full_exp && digits_[num_digits - 1] == '0')
          --num_digits;
        if (num_digits != full_exp) *it++ = decimal_point_;
        return copy_str<Char>(digits_ + full_exp, digits_ + num_digits, it);
      }
      *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + full_exp, digits_ + num_digits_, it);
      if (specs_.precision > num_digits_) {
        // Add trailing zeros.
        int num_zeros = specs_.precision - num_digits_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else {
      // 1234e-6 -> 0.001234
      *it++ = static_cast<Char>('0');
      int num_zeros = -full_exp;
      if (num_digits_ == 0 && specs_.precision >= 0 && specs_.precision < num_zeros)
        num_zeros = specs_.precision;
      int num_digits = num_digits_;
      if (!specs_.trailing_zeros)
        while (num_digits > 0 && digits_[num_digits - 1] == '0') --num_digits;
      if (num_zeros != 0 || num_digits != 0) {
        *it++ = decimal_point_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
        it = copy_str<Char>(digits_, digits_ + num_digits, it);
      }
    }
    return it;
  }